

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arena.h
# Opt level: O3

pair<long_*,_long_*> __thiscall memt::Arena::allocArrayNoCon<long>(Arena *this,size_t elementCount)

{
  long *plVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_t needed;
  pair<long_*,_long_*> pVar4;
  
  if (elementCount >> 0x3d == 0) {
    needed = elementCount * 8;
    plVar2 = (long *)(this->_blocks)._block._position;
    plVar1 = (long *)(this->_blocks)._block._end;
    if (((ulong)((long)plVar1 - (long)plVar2) <= elementCount * 8 - 1) &&
       ((elementCount != 0 || (needed = 1, plVar1 == plVar2)))) {
      growCapacity(this,needed);
      plVar2 = (long *)(this->_blocks)._block._position;
    }
    (this->_blocks)._block._position = (char *)((needed + 7 & 0xfffffffffffffff8) + (long)plVar2);
    pVar4.second = plVar2 + elementCount;
    pVar4.first = plVar2;
    return pVar4;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = dup2;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

std::pair<T*, T*> Arena::allocArrayNoCon(size_t elementCount) {
    if (elementCount > static_cast<size_t>(-1) / sizeof(T))
      throw std::bad_alloc();
    const size_t size = elementCount * sizeof(T);
    MEMT_ASSERT(size / sizeof(T) == elementCount);
    char* buffer = static_cast<char*>(alloc(size));
    T* array = reinterpret_cast<T*>(buffer);
    T* arrayEnd = reinterpret_cast<T*>(buffer + size);
    return std::make_pair(array, arrayEnd);
  }